

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_config_set_max_dispatch_interval
              (event_config *cfg,timeval *max_interval,int max_callbacks,int min_priority)

{
  int local_24;
  int local_20;
  int min_priority_local;
  int max_callbacks_local;
  timeval *max_interval_local;
  event_config *cfg_local;
  
  if (max_interval == (timeval *)0x0) {
    (cfg->max_dispatch_interval).tv_sec = -1;
  }
  else {
    (cfg->max_dispatch_interval).tv_sec = max_interval->tv_sec;
    (cfg->max_dispatch_interval).tv_usec = max_interval->tv_usec;
  }
  local_24 = max_callbacks;
  if (max_callbacks < 0) {
    local_24 = 0x7fffffff;
  }
  cfg->max_dispatch_callbacks = local_24;
  local_20 = min_priority;
  if (min_priority < 0) {
    local_20 = 0;
  }
  cfg->limit_callbacks_after_prio = local_20;
  return 0;
}

Assistant:

int
event_config_set_max_dispatch_interval(struct event_config *cfg,
    const struct timeval *max_interval, int max_callbacks, int min_priority)
{
	if (max_interval)
		memcpy(&cfg->max_dispatch_interval, max_interval,
		    sizeof(struct timeval));
	else
		cfg->max_dispatch_interval.tv_sec = -1;
	cfg->max_dispatch_callbacks =
	    max_callbacks >= 0 ? max_callbacks : INT_MAX;
	if (min_priority < 0)
		min_priority = 0;
	cfg->limit_callbacks_after_prio = min_priority;
	return (0);
}